

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::AperB_T(double **_A,double **_B,double **_res,int _righA,int _colA,int _righB,
                       int _colB)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  if (0 < _colA) {
    uVar4 = 1;
    do {
      if (0 < _colB) {
        pdVar1 = _res[uVar4];
        uVar6 = 1;
        do {
          pdVar1[uVar6] = 0.0;
          if (0 < _righA) {
            pdVar2 = _A[uVar4];
            pdVar3 = _B[uVar6];
            dVar7 = 0.0;
            uVar5 = 1;
            do {
              dVar7 = dVar7 + pdVar2[uVar5] * pdVar3[uVar5];
              pdVar1[uVar6] = dVar7;
              uVar5 = uVar5 + 1;
            } while (_righA + 1 != uVar5);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != _colB + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != _colA + 1);
  }
  return;
}

Assistant:

void EDCircles::AperB_T(double ** _A, double ** _B, double ** _res, int _righA, int _colA, int _righB, int _colB)
{
	int p, q, l;
	for (p = 1; p <= _colA; p++)
		for (q = 1; q <= _colB; q++)
		{
			_res[p][q] = 0.0;
			for (l = 1; l <= _righA; l++)
				_res[p][q] = _res[p][q] + _A[p][l] * _B[q][l];
		}
}